

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

double __thiscall soplex::SPxSolverBase<double>::maxInfeas(SPxSolverBase<double> *this)

{
  double dVar1;
  Type TVar2;
  int iVar3;
  double *pdVar4;
  SPxSolverBase<double> *in_RDI;
  int i_2;
  int i_1;
  int i;
  double inf;
  int in_stack_fffffffffffffecc;
  VectorBase<double> *in_stack_fffffffffffffed0;
  double local_128;
  double local_100;
  double local_d0;
  double local_a8;
  double local_78;
  double local_50;
  int local_1c;
  int local_18;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  TVar2 = type(in_RDI);
  if (TVar2 == ENTER) {
    if (((in_RDI->m_pricingViolUpToDate & 1U) != 0) && ((in_RDI->m_pricingViolCoUpToDate & 1U) != 0)
       ) {
      local_10 = in_RDI->m_pricingViol + in_RDI->m_pricingViolCo;
    }
    for (local_14 = 0; iVar3 = dim((SPxSolverBase<double> *)0x253952), local_14 < iVar3;
        local_14 = local_14 + 1) {
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      if (dVar1 < *pdVar4 || dVar1 == *pdVar4) {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (dVar1 < *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          dVar1 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          if (local_10 <= dVar1 - *pdVar4) {
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            local_78 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            local_78 = local_78 - *pdVar4;
          }
          else {
            local_78 = local_10;
          }
          local_10 = local_78;
        }
      }
      else {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (local_10 <= dVar1 - *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_50 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_50 = local_50 - *pdVar4;
        }
        else {
          local_50 = local_10;
        }
        local_10 = local_50;
      }
    }
  }
  else {
    if ((in_RDI->m_pricingViolUpToDate & 1U) != 0) {
      local_10 = in_RDI->m_pricingViol;
    }
    for (local_18 = 0; iVar3 = dim((SPxSolverBase<double> *)0x253c6d), local_18 < iVar3;
        local_18 = local_18 + 1) {
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      if (dVar1 < *pdVar4 || dVar1 == *pdVar4) {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (dVar1 < *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          dVar1 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          if (local_10 <= dVar1 - *pdVar4) {
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            local_d0 = *pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            local_d0 = local_d0 - *pdVar4;
          }
          else {
            local_d0 = local_10;
          }
          local_10 = local_d0;
        }
      }
      else {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (local_10 <= dVar1 - *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_a8 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_a8 = local_a8 - *pdVar4;
        }
        else {
          local_a8 = local_10;
        }
        local_10 = local_a8;
      }
    }
    for (local_1c = 0; iVar3 = coDim((SPxSolverBase<double> *)0x253f47), local_1c < iVar3;
        local_1c = local_1c + 1) {
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      dVar1 = *pdVar4;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      if (dVar1 < *pdVar4 || dVar1 == *pdVar4) {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (dVar1 < *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          dVar1 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          if (local_10 <= dVar1 - *pdVar4) {
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            in_stack_fffffffffffffed0 = (VectorBase<double> *)*pdVar4;
            pdVar4 = VectorBase<double>::operator[]
                               (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
            local_128 = (double)in_stack_fffffffffffffed0 - *pdVar4;
          }
          else {
            local_128 = local_10;
          }
          local_10 = local_128;
        }
      }
      else {
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        dVar1 = *pdVar4;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
        ;
        if (local_10 <= dVar1 - *pdVar4) {
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_100 = *pdVar4;
          pdVar4 = VectorBase<double>::operator[]
                             (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          local_100 = local_100 - *pdVar4;
        }
        else {
          local_100 = local_10;
        }
        local_10 = local_100;
      }
    }
  }
  return local_10;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }